

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Logger::notify_status(Logger *this,string *message)

{
  bool bVar1;
  reference rhs;
  LoggerClient *pLVar2;
  SmartPointer<GEO::LoggerClient> local_38;
  SmartPointer<GEO::LoggerClient> it;
  iterator __end1;
  iterator __begin1;
  LoggerClients *__range1;
  string *message_local;
  Logger *this_local;
  
  __end1 = std::
           set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
           ::begin(&this->clients_);
  it.pointer_ = (LoggerClient *)
                std::
                set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
                ::end(&this->clients_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) break;
    rhs = std::_Rb_tree_const_iterator<GEO::SmartPointer<GEO::LoggerClient>_>::operator*(&__end1);
    SmartPointer<GEO::LoggerClient>::SmartPointer(&local_38,rhs);
    pLVar2 = SmartPointer<GEO::LoggerClient>::operator->(&local_38);
    (*(pLVar2->super_Counted)._vptr_Counted[6])(pLVar2,message);
    SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_38);
    std::_Rb_tree_const_iterator<GEO::SmartPointer<GEO::LoggerClient>_>::operator++(&__end1);
  }
  this->current_feature_changed_ = false;
  return;
}

Assistant:

void Logger::notify_status(const std::string& message) {
        for(auto it : clients_) {
            it->status(message);
        }

        current_feature_changed_ = false;
    }